

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O0

void __thiscall
TPZCreateApproximationSpace::SetAllCreateFunctionsHCurl
          (TPZCreateApproximationSpace *this,int dimension)

{
  undefined4 *puVar1;
  int in_ESI;
  long in_RDI;
  HCurlFamily *hcurlfam;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  *(undefined4 *)(in_RDI + 0x118) = 4;
  puVar1 = (undefined4 *)(in_RDI + 0x114);
  if (in_ESI == 1) {
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar4 = *puVar1;
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(uVar4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 2) {
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar4 = *puVar1;
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar3 = *puVar1;
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (anon_class_4_1_5e8f657c *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    uVar2 = *puVar1;
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (anon_class_4_1_5e8f657c *)CONCAT44(uVar3,uVar2));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)CONCAT44(uVar3,uVar2));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)CONCAT44(uVar3,uVar2));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)CONCAT44(uVar3,uVar2));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar4),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)CONCAT44(uVar3,uVar2));
  }
  else if (in_ESI == 3) {
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (_func_TPZCompEl_ptr_TPZGeoEl_ptr_TPZCompMesh_ptr *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (anon_class_4_1_5e8f657c *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  return;
}

Assistant:

void TPZCreateApproximationSpace::SetAllCreateFunctionsHCurl(int dimension){

    fStyle = EHCurl;
    const HCurlFamily &hcurlfam = this->fhcurlfam;

    switch (dimension) {
    case 1:
        fp[EPoint] = CreateHCurlBoundPointEl;
        fp[EOned] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlLinearEl(gel,mesh,hcurlfam);};
        fp[ETriangle] = CreateNoElement;
        fp[EQuadrilateral] = CreateNoElement;
        fp[ETetraedro] = CreateNoElement;
        fp[EPiramide] = CreateNoElement;
        fp[EPrisma] = CreateNoElement;
        fp[ECube] = CreateNoElement;
        break;
    case 2:
        fp[EPoint] = CreateNoElement;
        fp[EOned] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlBoundLinearEl(gel,mesh,hcurlfam);};
        fp[ETriangle] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlTriangleEl(gel,mesh,hcurlfam);};
        fp[EQuadrilateral] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlQuadEl(gel,mesh,hcurlfam);};
        fp[ETetraedro] = CreateNoElement;
        fp[EPiramide] = CreateNoElement;
        fp[EPrisma] = CreateNoElement;
        fp[ECube] = CreateNoElement;
        break;
    case 3:
        fp[EPoint] = CreateNoElement;
        fp[EOned] = CreateNoElement;
        fp[ETriangle] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlTriangleEl(gel,mesh,hcurlfam);};
        fp[EQuadrilateral] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlBoundQuadEl(gel,mesh,hcurlfam);};
        fp[ETetraedro] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlTetraEl(gel,mesh,hcurlfam);};
        fp[EPiramide] = CreateHCurlPyramEl;
        fp[EPrisma] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlPrismEl(gel,mesh,hcurlfam);};
        fp[ECube] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlCubeEl(gel,mesh,hcurlfam);};
        break;
    default:
        DebugStop();
        break;
    }
    
}